

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

bool __thiscall ChebTools::ChebyshevExpansion::is_monotonic(ChebyshevExpansion *this)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ArrayXd diff;
  VectorXd yvals;
  void *local_a0;
  long local_98;
  undefined1 local_90 [16];
  double *local_80;
  double local_78;
  ChebyshevExpansion *local_68;
  double *local_60;
  long local_50;
  double *local_48;
  double local_40;
  ChebyshevExpansion *local_30;
  undefined8 local_28;
  long local_18;
  
  get_node_function_values((ChebyshevExpansion *)local_90);
  if ((long)local_90._8_8_ < 1 && (double *)local_90._0_8_ != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((long)local_90._8_8_ < 1) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  local_78 = (double)(local_90._8_8_ + -1);
  local_80 = (double *)(local_90._0_8_ + 8);
  local_60 = (double *)0x1;
  local_50 = local_90._8_8_;
  local_48 = (double *)local_90._0_8_;
  local_28 = 0;
  local_18 = local_90._8_8_;
  local_68 = (ChebyshevExpansion *)local_90;
  local_40 = local_78;
  local_30 = (ChebyshevExpansion *)local_90;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)&local_80);
  if (local_98 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Array<double, -1, 1>]"
                 );
  }
  bVar4 = true;
  if (local_98 != 0) {
    lVar3 = 0;
    do {
      pdVar1 = (double *)((long)local_a0 + lVar3 * 8);
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        lVar3 = 0;
        goto LAB_0010573f;
      }
      lVar3 = lVar3 + 1;
    } while (local_98 != lVar3);
  }
  goto LAB_00105759;
  while (bVar5 = local_98 + -1 != lVar3, lVar3 = lVar3 + 1, bVar5) {
LAB_0010573f:
    dVar2 = *(double *)((long)local_a0 + lVar3 * 8);
    bVar4 = 0.0 < dVar2;
    if (dVar2 <= 0.0) break;
  }
LAB_00105759:
  free(local_a0);
  free((void *)local_90._0_8_);
  return bVar4;
}

Assistant:

bool ChebyshevExpansion::is_monotonic() const {
        auto yvals = get_node_function_values();
        auto N = yvals.size();
        Eigen::ArrayXd diff = yvals.tail(N - 1) - yvals.head(N - 1);
        return (diff < 0.0).all() || (diff > 0.0).all();
    }